

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.cc
# Opt level: O0

void kratos::MergeIfVisitor::transform_block(StmtBlock *block)

{
  __node_base_ptr *pp_Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this;
  IfStmt *this_00;
  shared_ptr<kratos::IfStmt> *psVar2;
  bool bVar3;
  reference ppVar4;
  size_type sVar5;
  reference pvVar6;
  element_type *this_01;
  mapped_type *ppIVar7;
  __shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Var8;
  StmtBlock *pSVar9;
  reference stmt_00;
  shared_ptr<kratos::IfStmt> *psVar10;
  element_type *peVar11;
  pair<std::__detail::_Node_iterator<kratos::IfStmt_*,_true,_false>,_bool> pVar12;
  shared_ptr<kratos::Stmt> sVar13;
  enable_shared_from_this<kratos::Stmt> local_280;
  reference local_270;
  IfStmt **stmt_2;
  iterator __end2_1;
  iterator __begin2_1;
  unordered_set<kratos::IfStmt_*,_std::hash<kratos::IfStmt_*>,_std::equal_to<kratos::IfStmt_*>,_std::allocator<kratos::IfStmt_*>_>
  *__range2_1;
  element_type *local_240;
  shared_ptr<kratos::Stmt> local_238;
  _Node_iterator_base<kratos::IfStmt_*,_false> local_228;
  element_type *local_220;
  _Node_iterator_base<kratos::IfStmt_*,_false> local_218;
  reference local_210;
  shared_ptr<kratos::IfStmt> *stmt_1;
  uint64_t i;
  undefined1 local_1f8;
  element_type *local_1f0;
  reference local_1e8;
  shared_ptr<kratos::Stmt> *st_1;
  iterator __end6_1;
  iterator __begin6_1;
  element_type *__range6_1;
  shared_ptr<kratos::ScopedStmtBlock> *else_;
  shared_ptr<kratos::Stmt> *st;
  iterator __end6;
  iterator __begin6;
  element_type *__range6;
  shared_ptr<kratos::ScopedStmtBlock> *then;
  IfStmt *if_;
  element_type *local_180;
  _Node_iterator_base<std::pair<const_long,_kratos::IfStmt_*>,_false> local_178;
  _Node_iterator_base<std::pair<const_long,_kratos::IfStmt_*>,_false> local_170;
  int64_t local_168;
  int64_t const_value;
  type *const_;
  type *stmt;
  __normal_iterator<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>_*,_std::vector<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>_>_>_>
  local_148;
  iterator __end4;
  iterator __begin4;
  vector<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>_>_>
  *__range4;
  unordered_map<long,_kratos::IfStmt_*,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_kratos::IfStmt_*>_>_>
  mapping;
  shared_ptr<kratos::IfStmt> top_if;
  vector<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>_>_>
  stmts;
  pair<kratos::Var_*const,_std::vector<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>_>_>_>
  *iter;
  iterator __end2;
  iterator __begin2;
  map<kratos::Var_*,_std::vector<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>_>_>,_std::less<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_std::vector<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>_>_>_>_>_>
  *__range2;
  unordered_set<kratos::IfStmt_*,_std::hash<kratos::IfStmt_*>,_std::equal_to<kratos::IfStmt_*>,_std::allocator<kratos::IfStmt_*>_>
  merged_if;
  map<kratos::Var_*,_std::vector<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>_>_>,_std::less<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_std::vector<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>_>_>_>_>_>
  result;
  allocator<char> local_31;
  string local_30;
  StmtBlock *local_10;
  StmtBlock *block_local;
  
  local_10 = block;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"merge_if_block",&local_31)
  ;
  bVar3 = IRNode::has_attribute((IRNode *)block,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  if (((bVar3 ^ 0xffU) & 1) == 0) {
    pp_Var1 = &merged_if._M_h._M_single_bucket;
    std::
    map<kratos::Var_*,_std::vector<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>_>_>,_std::less<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_std::vector<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>_>_>_>_>_>
    ::map((map<kratos::Var_*,_std::vector<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>_>_>,_std::less<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_std::vector<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>_>_>_>_>_>
           *)pp_Var1);
    get_targeted_if(local_10,(map<kratos::Var_*,_std::vector<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>_>_>,_std::less<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_std::vector<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>_>_>_>_>_>
                              *)pp_Var1);
    std::
    unordered_set<kratos::IfStmt_*,_std::hash<kratos::IfStmt_*>,_std::equal_to<kratos::IfStmt_*>,_std::allocator<kratos::IfStmt_*>_>
    ::unordered_set((unordered_set<kratos::IfStmt_*,_std::hash<kratos::IfStmt_*>,_std::equal_to<kratos::IfStmt_*>,_std::allocator<kratos::IfStmt_*>_>
                     *)&__range2);
    pp_Var1 = &merged_if._M_h._M_single_bucket;
    __end2 = std::
             map<kratos::Var_*,_std::vector<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>_>_>,_std::less<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_std::vector<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>_>_>_>_>_>
             ::begin((map<kratos::Var_*,_std::vector<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>_>_>,_std::less<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_std::vector<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>_>_>_>_>_>
                      *)pp_Var1);
    iter = (pair<kratos::Var_*const,_std::vector<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>_>_>_>
            *)std::
              map<kratos::Var_*,_std::vector<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>_>_>,_std::less<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_std::vector<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>_>_>_>_>_>
              ::end((map<kratos::Var_*,_std::vector<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>_>_>,_std::less<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_std::vector<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>_>_>_>_>_>
                     *)pp_Var1);
    while (bVar3 = std::operator!=(&__end2,(_Self *)&iter), bVar3) {
      ppVar4 = std::
               _Rb_tree_iterator<std::pair<kratos::Var_*const,_std::vector<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>_>_>_>_>
               ::operator*(&__end2);
      std::
      vector<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>_>_>
      ::vector((vector<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>_>_>
                *)&top_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ,&ppVar4->second);
      sVar5 = std::
              vector<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>_>_>
              ::size((vector<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>_>_>
                      *)&top_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount);
      if (1 < sVar5) {
        pvVar6 = std::
                 vector<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>_>_>
                 ::operator[]((vector<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>_>_>
                               *)&top_if.
                                  super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount,0);
        std::shared_ptr<kratos::IfStmt>::shared_ptr
                  ((shared_ptr<kratos::IfStmt> *)&mapping._M_h._M_single_bucket,&pvVar6->first);
        std::
        unordered_map<long,_kratos::IfStmt_*,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_kratos::IfStmt_*>_>_>
        ::unordered_map((unordered_map<long,_kratos::IfStmt_*,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_kratos::IfStmt_*>_>_>
                         *)&__range4);
        this = &top_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        __end4 = std::
                 vector<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>_>_>
                 ::begin((vector<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>_>_>
                          *)this);
        local_148._M_current =
             (pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_> *)
             std::
             vector<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>_>_>
             ::end((vector<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>_>_>
                    *)this);
        while (bVar3 = __gnu_cxx::operator!=(&__end4,&local_148), bVar3) {
          stmt = &__gnu_cxx::
                  __normal_iterator<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>_*,_std::vector<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>_>_>_>
                  ::operator*(&__end4)->first;
          const_ = (type *)std::
                           get<0ul,std::shared_ptr<kratos::IfStmt>,std::shared_ptr<kratos::Const>>
                                     ((pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>
                                       *)stmt);
          const_value = (int64_t)std::
                                 get<1ul,std::shared_ptr<kratos::IfStmt>,std::shared_ptr<kratos::Const>>
                                           ((pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>
                                             *)stmt);
          this_01 = std::
                    __shared_ptr_access<kratos::Const,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                    operator->((__shared_ptr_access<kratos::Const,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)const_value);
          local_168 = Const::value(this_01);
          local_170._M_cur =
               (__node_type *)
               std::
               unordered_map<long,_kratos::IfStmt_*,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_kratos::IfStmt_*>_>_>
               ::find((unordered_map<long,_kratos::IfStmt_*,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_kratos::IfStmt_*>_>_>
                       *)&__range4,&local_168);
          local_178._M_cur =
               (__node_type *)
               std::
               unordered_map<long,_kratos::IfStmt_*,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_kratos::IfStmt_*>_>_>
               ::end((unordered_map<long,_kratos::IfStmt_*,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_kratos::IfStmt_*>_>_>
                      *)&__range4);
          bVar3 = std::__detail::operator==(&local_170,&local_178);
          if (bVar3) {
            local_180 = std::__shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>::get
                                  ((__shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2> *)
                                   const_);
            std::
            unordered_map<long,kratos::IfStmt*,std::hash<long>,std::equal_to<long>,std::allocator<std::pair<long_const,kratos::IfStmt*>>>
            ::emplace<long&,kratos::IfStmt*>
                      ((unordered_map<long,kratos::IfStmt*,std::hash<long>,std::equal_to<long>,std::allocator<std::pair<long_const,kratos::IfStmt*>>>
                        *)&__range4,&local_168,&local_180);
          }
          else {
            ppIVar7 = std::
                      unordered_map<long,_kratos::IfStmt_*,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_kratos::IfStmt_*>_>_>
                      ::at((unordered_map<long,_kratos::IfStmt_*,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_kratos::IfStmt_*>_>_>
                            *)&__range4,&local_168);
            this_00 = *ppIVar7;
            peVar11 = std::
                      __shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)const_);
            p_Var8 = (__shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)IfStmt::then_body(peVar11);
            pSVar9 = &std::
                      __shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator*(p_Var8)->super_StmtBlock;
            __end6 = StmtBlock::begin(pSVar9);
            st = (shared_ptr<kratos::Stmt> *)StmtBlock::end(pSVar9);
            while (bVar3 = __gnu_cxx::operator!=
                                     (&__end6,(__normal_iterator<std::shared_ptr<kratos::Stmt>_*,_std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>_>
                                               *)&st), bVar3) {
              stmt_00 = __gnu_cxx::
                        __normal_iterator<std::shared_ptr<kratos::Stmt>_*,_std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>_>
                        ::operator*(&__end6);
              IfStmt::add_then_stmt(this_00,stmt_00);
              __gnu_cxx::
              __normal_iterator<std::shared_ptr<kratos::Stmt>_*,_std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>_>
              ::operator++(&__end6);
            }
            peVar11 = std::
                      __shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)const_);
            p_Var8 = (__shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)IfStmt::else_body(peVar11);
            pSVar9 = &std::
                      __shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator*(p_Var8)->super_StmtBlock;
            __end6_1 = StmtBlock::begin(pSVar9);
            st_1 = (shared_ptr<kratos::Stmt> *)StmtBlock::end(pSVar9);
            while (bVar3 = __gnu_cxx::operator!=
                                     (&__end6_1,
                                      (__normal_iterator<std::shared_ptr<kratos::Stmt>_*,_std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>_>
                                       *)&st_1), bVar3) {
              local_1e8 = __gnu_cxx::
                          __normal_iterator<std::shared_ptr<kratos::Stmt>_*,_std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>_>
                          ::operator*(&__end6_1);
              IfStmt::add_else_stmt(this_00,local_1e8);
              __gnu_cxx::
              __normal_iterator<std::shared_ptr<kratos::Stmt>_*,_std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>_>
              ::operator++(&__end6_1);
            }
            local_1f0 = std::__shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>::get
                                  ((__shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2> *)
                                   const_);
            pVar12 = std::
                     unordered_set<kratos::IfStmt*,std::hash<kratos::IfStmt*>,std::equal_to<kratos::IfStmt*>,std::allocator<kratos::IfStmt*>>
                     ::emplace<kratos::IfStmt*>
                               ((unordered_set<kratos::IfStmt*,std::hash<kratos::IfStmt*>,std::equal_to<kratos::IfStmt*>,std::allocator<kratos::IfStmt*>>
                                 *)&__range2,&local_1f0);
            i = (uint64_t)pVar12.first.super__Node_iterator_base<kratos::IfStmt_*,_false>._M_cur;
            local_1f8 = pVar12.second;
          }
          __gnu_cxx::
          __normal_iterator<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>_*,_std::vector<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>_>_>_>
          ::operator++(&__end4);
        }
        for (stmt_1 = (shared_ptr<kratos::IfStmt> *)0x1; psVar2 = stmt_1,
            psVar10 = (shared_ptr<kratos::IfStmt> *)
                      std::
                      vector<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>_>_>
                      ::size((vector<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>_>_>
                              *)&top_if.
                                 super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount), psVar2 < psVar10;
            stmt_1 = (shared_ptr<kratos::IfStmt> *)
                     ((long)&(stmt_1->super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>
                             )._M_ptr + 1)) {
          local_210 = std::
                      vector<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>_>_>
                      ::operator[]((vector<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>_>_>
                                    *)&top_if.
                                       super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_refcount,(size_type)stmt_1);
          local_220 = std::__shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>::get
                                ((__shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2> *)
                                 local_210);
          local_218._M_cur =
               (__node_type *)
               std::
               unordered_set<kratos::IfStmt_*,_std::hash<kratos::IfStmt_*>,_std::equal_to<kratos::IfStmt_*>,_std::allocator<kratos::IfStmt_*>_>
               ::find((unordered_set<kratos::IfStmt_*,_std::hash<kratos::IfStmt_*>,_std::equal_to<kratos::IfStmt_*>,_std::allocator<kratos::IfStmt_*>_>
                       *)&__range2,&local_220);
          local_228._M_cur =
               (__node_type *)
               std::
               unordered_set<kratos::IfStmt_*,_std::hash<kratos::IfStmt_*>,_std::equal_to<kratos::IfStmt_*>,_std::allocator<kratos::IfStmt_*>_>
               ::end((unordered_set<kratos::IfStmt_*,_std::hash<kratos::IfStmt_*>,_std::equal_to<kratos::IfStmt_*>,_std::allocator<kratos::IfStmt_*>_>
                      *)&__range2);
          bVar3 = std::__detail::operator!=(&local_218,&local_228);
          if (!bVar3) {
            peVar11 = std::
                      __shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)&mapping._M_h._M_single_bucket);
            std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::IfStmt,void>
                      (&local_238,&local_210->first);
            IfStmt::add_else_stmt(peVar11,&local_238);
            std::shared_ptr<kratos::Stmt>::~shared_ptr(&local_238);
            local_240 = std::__shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>::get
                                  ((__shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2> *)
                                   local_210);
            std::
            unordered_set<kratos::IfStmt*,std::hash<kratos::IfStmt*>,std::equal_to<kratos::IfStmt*>,std::allocator<kratos::IfStmt*>>
            ::emplace<kratos::IfStmt*>
                      ((unordered_set<kratos::IfStmt*,std::hash<kratos::IfStmt*>,std::equal_to<kratos::IfStmt*>,std::allocator<kratos::IfStmt*>>
                        *)&__range2,&local_240);
          }
        }
        std::
        unordered_map<long,_kratos::IfStmt_*,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_kratos::IfStmt_*>_>_>
        ::~unordered_map((unordered_map<long,_kratos::IfStmt_*,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_kratos::IfStmt_*>_>_>
                          *)&__range4);
        std::shared_ptr<kratos::IfStmt>::~shared_ptr
                  ((shared_ptr<kratos::IfStmt> *)&mapping._M_h._M_single_bucket);
      }
      std::
      vector<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>_>_>
      ::~vector((vector<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>_>_>
                 *)&top_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
      std::
      _Rb_tree_iterator<std::pair<kratos::Var_*const,_std::vector<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>_>_>_>_>
      ::operator++(&__end2);
    }
    __end2_1 = std::
               unordered_set<kratos::IfStmt_*,_std::hash<kratos::IfStmt_*>,_std::equal_to<kratos::IfStmt_*>,_std::allocator<kratos::IfStmt_*>_>
               ::begin((unordered_set<kratos::IfStmt_*,_std::hash<kratos::IfStmt_*>,_std::equal_to<kratos::IfStmt_*>,_std::allocator<kratos::IfStmt_*>_>
                        *)&__range2);
    stmt_2 = (IfStmt **)
             std::
             unordered_set<kratos::IfStmt_*,_std::hash<kratos::IfStmt_*>,_std::equal_to<kratos::IfStmt_*>,_std::allocator<kratos::IfStmt_*>_>
             ::end((unordered_set<kratos::IfStmt_*,_std::hash<kratos::IfStmt_*>,_std::equal_to<kratos::IfStmt_*>,_std::allocator<kratos::IfStmt_*>_>
                    *)&__range2);
    while (bVar3 = std::__detail::operator!=
                             (&__end2_1.super__Node_iterator_base<kratos::IfStmt_*,_false>,
                              (_Node_iterator_base<kratos::IfStmt_*,_false> *)&stmt_2), bVar3) {
      local_270 = std::__detail::_Node_iterator<kratos::IfStmt_*,_true,_false>::operator*(&__end2_1)
      ;
      pSVar9 = local_10;
      sVar13 = std::enable_shared_from_this<kratos::Stmt>::shared_from_this(&local_280);
      (*(pSVar9->super_Stmt).super_IRNode._vptr_IRNode[10])
                (pSVar9,&local_280,
                 sVar13.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi._M_pi);
      std::shared_ptr<kratos::Stmt>::~shared_ptr((shared_ptr<kratos::Stmt> *)&local_280);
      std::__detail::_Node_iterator<kratos::IfStmt_*,_true,_false>::operator++(&__end2_1);
    }
    std::
    unordered_set<kratos::IfStmt_*,_std::hash<kratos::IfStmt_*>,_std::equal_to<kratos::IfStmt_*>,_std::allocator<kratos::IfStmt_*>_>
    ::~unordered_set((unordered_set<kratos::IfStmt_*,_std::hash<kratos::IfStmt_*>,_std::equal_to<kratos::IfStmt_*>,_std::allocator<kratos::IfStmt_*>_>
                      *)&__range2);
    std::
    map<kratos::Var_*,_std::vector<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>_>_>,_std::less<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_std::vector<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>_>_>_>_>_>
    ::~map((map<kratos::Var_*,_std::vector<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>_>_>,_std::less<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_std::vector<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>_>_>_>_>_>
            *)&merged_if._M_h._M_single_bucket);
  }
  return;
}

Assistant:

void static transform_block(StmtBlock* block) {
        // only run marked ones
        if (!block->has_attribute("merge_if_block")) return;
        std::map<Var*, std::vector<IfStmtType>> result;
        get_targeted_if(block, result);
        std::unordered_set<IfStmt*> merged_if;
        for (auto const& iter : result) {
            auto stmts = iter.second;
            if (stmts.size() > 1) {
                // we have stmts to merge
                auto top_if = stmts[0].first;
                // first pass to merge the if statements with the same constant value
                // build index on the const values
                std::unordered_map<int64_t, IfStmt*> mapping;
                for (const auto& [stmt, const_] : stmts) {
                    auto const_value = const_->value();
                    if (mapping.find(const_value) == mapping.end()) {
                        mapping.emplace(const_value, stmt.get());
                    } else {
                        // merge the current one into the one we already have
                        auto* if_ = mapping.at(const_value);
                        auto const& then = stmt->then_body();
                        for (auto const& st : *then) {
                            if_->add_then_stmt(st);
                        }
                        auto const& else_ = stmt->else_body();
                        for (auto const& st : *else_) {
                            if_->add_else_stmt(st);
                        }
                        merged_if.emplace(stmt.get());
                    }
                }

                // second pass to nest the if statement
                for (uint64_t i = 1; i < stmts.size(); i++) {
                    auto const& stmt = stmts[i].first;
                    if (merged_if.find(stmt.get()) != merged_if.end()) {
                        continue;
                    }
                    // put the one in the top if
                    top_if->add_else_stmt(stmt);
                    merged_if.emplace(stmt.get());
                }
            }
        }
        // remove merged if
        for (auto const& stmt : merged_if) {
            block->remove_stmt(stmt->shared_from_this());
        }
    }